

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_user_geometry.h
# Opt level: O1

PrimInfo * __thiscall
embree::sse2::UserGeometryISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,UserGeometryISA *this,PrimRef *prims,BBox1f *time_range,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  float fVar4;
  undefined4 uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  float fVar9;
  BBox1f BVar10;
  undefined1 extraout_var [12];
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar21;
  float fVar22;
  undefined1 auVar18 [16];
  float fVar23;
  undefined1 auVar19 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar20;
  float fVar27;
  float fVar28;
  undefined1 auVar24 [16];
  float fVar29;
  undefined1 auVar25 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar26;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> bi;
  BBox3fa box;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  undefined8 local_1b8;
  float fStack_1b0;
  float fStack_1ac;
  undefined8 local_1a8;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  size_t local_188;
  ulong local_180;
  range<unsigned_long> *local_178;
  size_t local_170;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined8 local_f8;
  float fStack_f0;
  float fStack_ec;
  undefined8 local_e8;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  PrimInfo *local_b8;
  PrimRef *local_b0;
  undefined8 local_a8;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  float fStack_90;
  float fStack_8c;
  undefined8 local_88;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  float fStack_70;
  float fStack_6c;
  void *local_60;
  undefined4 local_58;
  int local_54;
  undefined8 *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  local_170 = k;
  local_b0 = prims;
  BVar10 = Geometry::getTimeRange((Geometry *)this);
  fVar4 = time_range->lower;
  if (time_range->lower <= BVar10.lower) {
    fVar4 = BVar10.lower;
  }
  fStack_44 = BVar10.upper;
  local_48 = fStack_44;
  if (time_range->upper <= fStack_44) {
    local_48 = time_range->upper;
  }
  if (fVar4 <= local_48) {
    uVar6 = r->_begin;
    local_128 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                 lower.field_0.m128;
    local_138 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                 upper.field_0.m128;
    local_148 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                 lower.field_0.m128;
    local_158 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                 upper.field_0.m128;
    local_188 = __return_storage_ptr__->end;
    local_178 = r;
    local_b8 = __return_storage_ptr__;
    fStack_40 = fStack_44;
    fStack_3c = fStack_44;
    if (uVar6 < r->_end) {
      do {
        BVar10 = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range;
        auVar19._0_4_ = (this->super_UserGeometry).super_AccelSet.super_Geometry.fnumTimeSegments;
        fVar9 = BVar10.lower;
        auVar19._8_4_ = BVar10.upper - fVar9;
        auVar19._12_4_ = local_48 - fVar9;
        auVar19._4_4_ = floorf(((fVar4 - fVar9) / auVar19._8_4_) * 1.0000002 * auVar19._0_4_);
        fVar9 = 0.0;
        if (0.0 <= auVar19._4_4_) {
          fVar9 = auVar19._4_4_;
        }
        auVar19._4_4_ = (float)(int)fVar9;
        fVar9 = ceilf((auVar19._12_4_ / auVar19._8_4_) * 0.99999976 * auVar19._0_4_);
        if (auVar19._0_4_ <= fVar9) {
          fVar9 = auVar19._0_4_;
        }
        auVar19._0_4_ = (float)(int)fVar9;
        bVar2 = (uint)auVar19._0_4_ < (uint)auVar19._4_4_;
        fVar9 = (float)uVar6;
        if ((uint)auVar19._4_4_ <= (uint)auVar19._0_4_) {
          uVar7 = (ulong)(int)auVar19._4_4_;
          do {
            local_1b8 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
            local_1a8 = &local_d8;
            fStack_1b0 = fVar9;
            fStack_1ac = auVar19._4_4_;
            uVar5 = (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58
                    )(&local_1b8);
            auVar25._0_4_ =
                 -(uint)((-1.844e+18 < local_d8 && local_c8 < 1.844e+18) && local_d8 <= local_c8);
            auVar25._4_4_ =
                 -(uint)((-1.844e+18 < fStack_d4 && fStack_c4 < 1.844e+18) && fStack_d4 <= fStack_c4
                        );
            auVar25._8_4_ =
                 -(uint)((-1.844e+18 < fStack_d0 && fStack_c0 < 1.844e+18) && fStack_d0 <= fStack_c0
                        );
            auVar25._12_4_ =
                 -(uint)((-1.844e+18 < fStack_cc && fStack_bc < 1.844e+18) && fStack_cc <= fStack_bc
                        );
            uVar5 = movmskps(uVar5,auVar25);
            if ((~(byte)uVar5 & 7) != 0) {
              auVar19 = _DAT_01feb9f0;
              auVar13 = _DAT_01feba00;
              auVar18 = _DAT_01feba00;
              auVar24 = _DAT_01feb9f0;
              if (!bVar2) goto LAB_00a1c975;
              break;
            }
            uVar7 = uVar7 + 1;
            auVar19._4_4_ = (float)((int)auVar19._4_4_ + 1);
            bVar2 = (ulong)(long)(int)auVar19._0_4_ < uVar7;
          } while (uVar7 <= (ulong)(long)(int)auVar19._0_4_);
        }
        fVar1 = (this->super_UserGeometry).super_AccelSet.super_Geometry.fnumTimeSegments;
        auVar19._0_4_ = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range.lower;
        fVar12 = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range.upper -
                 auVar19._0_4_;
        fVar17 = (fVar4 - auVar19._0_4_) / fVar12;
        fVar12 = (local_48 - auVar19._0_4_) / fVar12;
        local_198 = fVar1 * fVar12;
        auVar19._4_4_ = floorf(fVar1 * fVar17);
        auVar19._8_4_ = ceilf(local_198);
        auVar19._0_4_ = auVar19._4_4_;
        if (auVar19._4_4_ <= 0.0) {
          auVar19._0_4_ = 0.0;
        }
        auVar19._12_4_ = auVar19._8_4_;
        if (fVar1 <= auVar19._8_4_) {
          auVar19._12_4_ = fVar1;
        }
        register0x00001204 = extraout_var;
        local_168._0_4_ = auVar19._12_4_;
        fStack_1ac = (float)(int)auVar19._0_4_;
        iVar8 = (int)auVar19._4_4_;
        if ((int)auVar19._4_4_ < 0) {
          iVar8 = -1;
        }
        iVar3 = (int)fVar1 + 1;
        if ((int)auVar19._8_4_ < (int)fVar1 + 1) {
          iVar3 = (int)auVar19._8_4_;
        }
        local_1b8 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
        local_1a8 = &local_d8;
        fStack_1b0 = fVar9;
        local_118 = fStack_1ac;
        (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)
                  (&local_1b8);
        local_88 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
        local_78 = &local_1b8;
        local_108 = (float)(int)auVar19._12_4_;
        fStack_80 = fVar9;
        fStack_7c = (float)(int)auVar19._12_4_;
        (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)(&local_88)
        ;
        auVar19._0_4_ = fVar1 * fVar17 - auVar19._0_4_;
        if (iVar3 - iVar8 == 1) {
          if (auVar19._0_4_ <= 0.0) {
            auVar19._0_4_ = 0.0;
          }
          fVar9 = 1.0 - auVar19._0_4_;
          auVar24._0_4_ = fVar9 * local_d8 + auVar19._0_4_ * (float)local_1b8;
          auVar24._4_4_ = fVar9 * fStack_d4 + auVar19._0_4_ * local_1b8._4_4_;
          auVar24._8_4_ = fVar9 * fStack_d0 + auVar19._0_4_ * fStack_1b0;
          auVar24._12_4_ = fVar9 * fStack_cc + auVar19._0_4_ * fStack_1ac;
          auVar18._0_4_ = fVar9 * local_c8 + auVar19._0_4_ * (float)local_1a8;
          auVar18._4_4_ = fVar9 * fStack_c4 + auVar19._0_4_ * local_1a8._4_4_;
          auVar18._8_4_ = fVar9 * fStack_c0 + auVar19._0_4_ * fStack_1a0;
          auVar18._12_4_ = fVar9 * fStack_bc + auVar19._0_4_ * fStack_19c;
          fVar9 = (float)local_168._0_4_ - local_198;
          if (fVar9 <= 0.0) {
            fVar9 = 0.0;
          }
          auVar13._12_4_ = 1.0 - fVar9;
          auVar19._0_4_ = (float)local_1b8 * auVar13._12_4_ + local_d8 * fVar9;
          auVar19._4_4_ = local_1b8._4_4_ * auVar13._12_4_ + fStack_d4 * fVar9;
          auVar19._8_4_ = fStack_1b0 * auVar13._12_4_ + fStack_d0 * fVar9;
          auVar19._12_4_ = fStack_1ac * auVar13._12_4_ + fStack_cc * fVar9;
          auVar13._0_4_ = auVar13._12_4_ * (float)local_1a8 + fVar9 * local_c8;
          auVar13._4_4_ = auVar13._12_4_ * local_1a8._4_4_ + fVar9 * fStack_c4;
          auVar13._8_4_ = auVar13._12_4_ * fStack_1a0 + fVar9 * fStack_c0;
          auVar13._12_4_ = auVar13._12_4_ * fStack_19c + fVar9 * fStack_bc;
        }
        else {
          fStack_9c = (float)((int)local_118 + 1);
          local_a8 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
          fStack_a0 = fVar9;
          local_98 = &local_88;
          (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)
                    (&local_a8);
          fStack_ec = (float)((int)local_108 + -1);
          local_f8 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
          local_180 = uVar6;
          fStack_f0 = fVar9;
          local_e8 = &local_a8;
          (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)
                    (&local_f8);
          uVar6 = local_180;
          if (auVar19._0_4_ <= 0.0) {
            auVar19._0_4_ = 0.0;
          }
          fVar9 = 1.0 - auVar19._0_4_;
          auVar24._0_4_ = local_d8 * fVar9 + (float)local_88 * auVar19._0_4_;
          auVar24._4_4_ = fStack_d4 * fVar9 + local_88._4_4_ * auVar19._0_4_;
          auVar24._8_4_ = fStack_d0 * fVar9 + fStack_80 * auVar19._0_4_;
          auVar24._12_4_ = fStack_cc * fVar9 + fStack_7c * auVar19._0_4_;
          auVar18._0_4_ = fVar9 * local_c8 + auVar19._0_4_ * (float)local_78;
          auVar18._4_4_ = fVar9 * fStack_c4 + auVar19._0_4_ * local_78._4_4_;
          auVar18._8_4_ = fVar9 * fStack_c0 + auVar19._0_4_ * fStack_70;
          auVar18._12_4_ = fVar9 * fStack_bc + auVar19._0_4_ * fStack_6c;
          fVar9 = (float)local_168._0_4_ - local_198;
          if (fVar9 <= 0.0) {
            fVar9 = 0.0;
          }
          auVar13._12_4_ = 1.0 - fVar9;
          auVar19._0_4_ = (float)local_1b8 * auVar13._12_4_ + (float)local_a8 * fVar9;
          auVar19._4_4_ = local_1b8._4_4_ * auVar13._12_4_ + local_a8._4_4_ * fVar9;
          auVar19._8_4_ = fStack_1b0 * auVar13._12_4_ + fStack_a0 * fVar9;
          auVar19._12_4_ = fStack_1ac * auVar13._12_4_ + fStack_9c * fVar9;
          auVar13._0_4_ = auVar13._12_4_ * (float)local_1a8 + fVar9 * (float)local_98;
          auVar13._4_4_ = auVar13._12_4_ * local_1a8._4_4_ + fVar9 * local_98._4_4_;
          auVar13._8_4_ = auVar13._12_4_ * fStack_1a0 + fVar9 * fStack_90;
          auVar13._12_4_ = auVar13._12_4_ * fStack_19c + fVar9 * fStack_8c;
          iVar8 = iVar8 + 1;
          if (iVar8 < iVar3) {
            do {
              local_168._4_4_ = auVar13._4_4_;
              local_168._0_4_ = auVar13._0_4_;
              fStack_160 = auVar13._8_4_;
              fStack_15c = auVar13._12_4_;
              fVar9 = ((float)iVar8 / fVar1 - fVar17) / (fVar12 - fVar17);
              fVar16 = 1.0 - fVar9;
              fVar27 = auVar24._4_4_;
              fVar28 = auVar24._8_4_;
              fVar29 = auVar24._12_4_;
              local_198 = auVar24._0_4_ * fVar16 + auVar19._0_4_ * fVar9;
              fStack_194 = fVar27 * fVar16 + auVar19._4_4_ * fVar9;
              fStack_190 = fVar28 * fVar16 + auVar19._8_4_ * fVar9;
              fStack_18c = fVar29 * fVar16 + auVar19._12_4_ * fVar9;
              fVar21 = auVar18._4_4_;
              fVar22 = auVar18._8_4_;
              fVar23 = auVar18._12_4_;
              local_108 = fVar16 * auVar18._0_4_ + fVar9 * auVar13._0_4_;
              fStack_104 = fVar16 * fVar21 + fVar9 * auVar13._4_4_;
              fStack_100 = fVar16 * fVar22 + fVar9 * auVar13._8_4_;
              fStack_fc = fVar16 * fVar23 + fVar9 * auVar13._12_4_;
              local_60 = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr;
              local_58 = (undefined4)uVar6;
              local_50 = &local_f8;
              local_118 = auVar19._0_4_;
              fStack_114 = auVar19._4_4_;
              fStack_110 = auVar19._8_4_;
              fStack_10c = auVar19._12_4_;
              local_54 = iVar8;
              (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)
                        (&local_60);
              auVar15._0_4_ = (float)local_f8 - local_198;
              auVar15._4_4_ = local_f8._4_4_ - fStack_194;
              auVar15._8_4_ = fStack_f0 - fStack_190;
              auVar15._12_4_ = fStack_ec - fStack_18c;
              auVar14._0_4_ = (float)local_e8 - local_108;
              auVar14._4_4_ = local_e8._4_4_ - fStack_104;
              auVar14._8_4_ = fStack_e0 - fStack_100;
              auVar14._12_4_ = fStack_dc - fStack_fc;
              auVar25 = minps(auVar15,ZEXT816(0));
              auVar15 = maxps(auVar14,ZEXT816(0));
              auVar24._0_4_ = auVar24._0_4_ + auVar25._0_4_;
              auVar24._4_4_ = fVar27 + auVar25._4_4_;
              auVar24._8_4_ = fVar28 + auVar25._8_4_;
              auVar24._12_4_ = fVar29 + auVar25._12_4_;
              auVar19._0_4_ = auVar25._0_4_ + local_118;
              auVar19._4_4_ = auVar25._4_4_ + fStack_114;
              auVar19._8_4_ = auVar25._8_4_ + fStack_110;
              auVar19._12_4_ = auVar25._12_4_ + fStack_10c;
              auVar18._0_4_ = auVar18._0_4_ + auVar15._0_4_;
              auVar18._4_4_ = fVar21 + auVar15._4_4_;
              auVar18._8_4_ = fVar22 + auVar15._8_4_;
              auVar18._12_4_ = fVar23 + auVar15._12_4_;
              auVar13._0_4_ = auVar15._0_4_ + (float)local_168._0_4_;
              auVar13._4_4_ = auVar15._4_4_ + (float)local_168._4_4_;
              auVar13._8_4_ = auVar15._8_4_ + fStack_160;
              auVar13._12_4_ = auVar15._12_4_ + fStack_15c;
              iVar8 = iVar8 + 1;
            } while (iVar3 != iVar8);
          }
          else {
          }
        }
LAB_00a1c975:
        if (bVar2) {
          auVar25 = minps(auVar24,auVar19);
          auVar19 = maxps(auVar18,auVar13);
          aVar26._0_12_ = auVar25._0_12_;
          aVar26.m128[3] = (float)geomID;
          aVar20._0_12_ = auVar19._0_12_;
          aVar20.m128[3] = (float)uVar6;
          local_128 = minps(local_128,(undefined1  [16])aVar26);
          local_138 = maxps(local_138,(undefined1  [16])aVar20);
          auVar11._0_4_ = auVar25._0_4_ + auVar19._0_4_;
          auVar11._4_4_ = auVar25._4_4_ + auVar19._4_4_;
          auVar11._8_4_ = auVar25._8_4_ + auVar19._8_4_;
          auVar11._12_4_ = (float)geomID + (float)uVar6;
          local_148 = minps(local_148,auVar11);
          local_158 = maxps(local_158,auVar11);
          local_188 = local_188 + 1;
          local_b0[local_170].lower.field_0 = aVar26;
          local_b0[local_170].upper.field_0 = aVar20;
          local_170 = local_170 + 1;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < local_178->_end);
    }
    *(undefined8 *)
     &(local_b8->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
         local_128._0_8_;
    *(undefined8 *)
     ((long)&(local_b8->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 + 8)
         = local_128._8_8_;
    *(undefined8 *)
     &(local_b8->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
         local_138._0_8_;
    *(undefined8 *)
     ((long)&(local_b8->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 + 8)
         = local_138._8_8_;
    *(undefined8 *)
     &(local_b8->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
         local_148._0_8_;
    *(undefined8 *)
     ((long)&(local_b8->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 + 8)
         = local_148._8_8_;
    *(undefined8 *)
     &(local_b8->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
         local_158._0_8_;
    *(undefined8 *)
     ((long)&(local_b8->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 + 8)
         = local_158._8_8_;
    local_b8->end = local_188;
    __return_storage_ptr__ = local_b8;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(getTimeRange(), time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j = r.begin(); j < r.end(); j++) {
          LBBox3fa lbounds = empty;
          if (!linearBounds(j, t0t1, lbounds))
            continue;
          const PrimRef prim(lbounds.bounds(), geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }